

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2text_format.cc
# Opt level: O2

bool __thiscall
s2textformat::MakeLoop
          (s2textformat *this,string_view str,unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *loop
          ,S2Debug debug_override)

{
  string_view y;
  _Head_base<0UL,_S2Loop_*,_false> _Var1;
  bool bVar2;
  string_view x;
  string_view x_00;
  string_view str_00;
  vector<Vector3<double>,_std::allocator<Vector3<double>_>_> vertices;
  S2Debug local_71;
  _Head_base<0UL,_S2Loop_*,_false> local_70;
  _Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_> local_68;
  string_view local_48;
  string_view local_38;
  
  x.length_ = str.ptr_;
  local_71 = (S2Debug)loop;
  absl::string_view::string_view(&local_38,"empty");
  x.ptr_ = (char *)this;
  bVar2 = absl::operator==(x,local_38);
  if (bVar2) {
    S2Loop::kEmpty();
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_70,
               (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68);
  }
  else {
    absl::string_view::string_view(&local_48,"full");
    y.length_ = local_48.length_;
    y.ptr_ = local_48.ptr_;
    x_00.length_ = (size_type)x.length_;
    x_00.ptr_ = (char *)this;
    bVar2 = absl::operator==(x_00,y);
    if (!bVar2) {
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      str_00.length_ = (size_type)&local_68;
      str_00.ptr_ = x.length_;
      bVar2 = ParsePoints(this,str_00,
                          (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)
                          local_48.length_);
      if (bVar2) {
        absl::
        make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>&,S2Debug&>
                  ((absl *)&local_70,
                   (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68,&local_71
                  );
        _Var1._M_head_impl = local_70._M_head_impl;
        local_70._M_head_impl = (pointer)0x0;
        std::__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>::reset
                  ((__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> *)str.length_,
                   _Var1._M_head_impl);
        std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr
                  ((unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_70);
      }
      std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base
                (&local_68);
      return bVar2;
    }
    S2Loop::kFull();
    absl::make_unique<S2Loop,std::vector<Vector3<double>,std::allocator<Vector3<double>>>>
              ((absl *)&local_70,
               (vector<Vector3<double>,_std::allocator<Vector3<double>_>_> *)&local_68);
  }
  _Var1._M_head_impl = local_70._M_head_impl;
  local_70._M_head_impl = (S2Loop *)0x0;
  std::__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>::reset
            ((__uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> *)str.length_,_Var1._M_head_impl
            );
  std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>::~unique_ptr
            ((unique_ptr<S2Loop,_std::default_delete<S2Loop>_> *)&local_70);
  std::_Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>::~_Vector_base(&local_68);
  return true;
}

Assistant:

bool MakeLoop(string_view str, unique_ptr<S2Loop>* loop,
              S2Debug debug_override) {
  if (str == "empty") {
    *loop = make_unique<S2Loop>(S2Loop::kEmpty());
    return true;
  }
  if (str == "full") {
    *loop = make_unique<S2Loop>(S2Loop::kFull());
    return true;
  }
  vector<S2Point> vertices;
  if (!ParsePoints(str, &vertices)) return false;
  *loop = make_unique<S2Loop>(vertices, debug_override);
  return true;
}